

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Signaler::Signal(Signaler *this)

{
  ssize_t sVar1;
  SystemException *this_00;
  int *piVar2;
  char byte;
  undefined1 local_41;
  string local_40;
  
  local_41 = 0;
  sVar1 = write((this->pipefd_)._M_elems[1],&local_41,1);
  if (sVar1 == 1) {
    return;
  }
  this_00 = (SystemException *)__cxa_allocate_exception(0x18);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"write pipe","");
  piVar2 = __errno_location();
  SystemException::SystemException(this_00,&local_40,*piVar2);
  __cxa_throw(this_00,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Signal() {
            char byte = {};
            RESTINCURL_LOG_TRACE("Signal: Signaling!");
            if (write(pipefd_[FD_WRITE], &byte, 1) != 1) {
                throw SystemException("write pipe", errno);
            }
        }